

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void init_proc_970(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  CPUPPCState_conflict3 *__mptr;
  undefined8 uVar2;
  
  init_proc_book3s_common(env);
  gen_spr_sdr1(env);
  gen_spr_book3s_dbg(env);
  gen_spr_970_hid(env);
  gen_spr_970_hior(env);
  gen_low_BATs(env);
  gen_spr_970_pmu_sup(env);
  gen_spr_970_pmu_user(env);
  if ((((env->spr_cb[0x3f4].name == (char *)0x0) && (env->spr[0x3f4] == 0)) &&
      (env->spr_cb[0x3f4].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
     (((env->spr_cb[0x3f4].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x3f4].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      (env->spr_cb[0x3f4].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
    env->spr_cb[0x3f4].name = "HID4";
    env->spr_cb[0x3f4].uea_read = spr_noaccess;
    env->spr_cb[0x3f4].uea_write = spr_noaccess;
    env->spr_cb[0x3f4].oea_read = spr_read_generic;
    env->spr_cb[0x3f4].oea_write = spr_write_generic;
    env->spr_cb[0x3f4].hea_read = spr_read_generic;
    env->spr_cb[0x3f4].hea_write = spr_write_generic;
    env->spr_cb[0x3f4].default_value = 0;
    env->spr[0x3f4] = 0;
    if (((env->spr_cb[0x3f2].name == (char *)0x0) && (env->spr[0x3f2] == 0)) &&
       ((env->spr_cb[0x3f2].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x3f2].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x3f2].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x3f2].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x3f2].name = "IABR";
      env->spr_cb[0x3f2].uea_read = spr_noaccess;
      env->spr_cb[0x3f2].uea_write = spr_noaccess;
      env->spr_cb[0x3f2].oea_read = spr_read_generic;
      env->spr_cb[0x3f2].oea_write = spr_write_generic;
      env->spr_cb[0x3f2].hea_read = spr_read_generic;
      env->spr_cb[0x3f2].hea_write = spr_write_generic;
      env->spr_cb[0x3f2].default_value = 0;
      env->spr[0x3f2] = 0;
      env->dcache_line_size = 0x80;
      env->icache_line_size = 0x80;
      env->excp_vectors[0x40] = 0x100;
      env->excp_vectors[1] = 0x200;
      env->excp_vectors[2] = 0x300;
      env->excp_vectors[0x41] = 0x380;
      env->excp_vectors[3] = 0x400;
      env->excp_vectors[0x42] = 0x480;
      env->excp_vectors[4] = 0x500;
      env->excp_vectors[5] = 0x600;
      env->excp_vectors[6] = 0x700;
      env->excp_vectors[7] = 0x800;
      env->excp_vectors[10] = 0x900;
      env->excp_vectors[0x43] = 0x980;
      env->excp_vectors[8] = 0xc00;
      env->excp_vectors[0x44] = 0xd00;
      env->excp_vectors[0x55] = 0xf00;
      env->excp_vectors[0x49] = 0xf20;
      env->excp_vectors[0x53] = 0x1300;
      env->excp_vectors[0x59] = 0x1600;
      env->excp_vectors[0x57] = 0x1700;
      env->excp_vectors[0x56] = 0x1800;
      env->hreset_vector = 0x100;
      ppc970_irq_init((PowerPCCPU_conflict3 *)&env[-1].spr_cb[0x1bf].oea_write);
      return;
    }
    uVar2 = 0x3f2;
    uVar1 = 0x3f2;
  }
  else {
    uVar2 = 0x3f4;
    uVar1 = 0x3f4;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void init_proc_970(CPUPPCState *env)
{
    /* Common Registers */
    init_proc_book3s_common(env);
    gen_spr_sdr1(env);
    gen_spr_book3s_dbg(env);

    /* 970 Specific Registers */
    gen_spr_970_hid(env);
    gen_spr_970_hior(env);
    gen_low_BATs(env);
    gen_spr_970_pmu_sup(env);
    gen_spr_970_pmu_user(env);
    gen_spr_970_lpar(env);
    gen_spr_970_dbg(env);

    /* env variables */
    env->dcache_line_size = 128;
    env->icache_line_size = 128;

    /* Allocate hardware IRQ controller */
    init_excp_970(env);
    ppc970_irq_init(env_archcpu(env));
}